

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O2

Vector<float,_4> __thiscall
rr::readLineVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  Vector<float,_4> VVar1;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  tcu local_50 [16];
  tcu local_40 [16];
  
  local_68.m_data._0_8_ = *(undefined8 *)&context->varyings[0][varyingLoc].v;
  local_68.m_data._8_8_ = *(undefined8 *)((long)&context->varyings[0][varyingLoc].v + 8);
  tcu::operator*(local_40,packet->barycentric[0].m_data[fragNdx],&local_68);
  local_78.m_data._0_8_ = *(undefined8 *)&context->varyings[1][varyingLoc].v;
  local_78.m_data._8_8_ = *(undefined8 *)((long)&context->varyings[1][varyingLoc].v + 8);
  tcu::operator*(local_50,packet->barycentric[1].m_data[fragNdx],&local_78);
  VVar1 = tcu::operator+((tcu *)this,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_50);
  return (Vector<float,_4>)VVar1.m_data;
}

Assistant:

tcu::Vector<T, 4> readLineVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	return   packet.barycentric[0][fragNdx] * context.varyings[0][varyingLoc].get<T>()
		   + packet.barycentric[1][fragNdx] * context.varyings[1][varyingLoc].get<T>();
}